

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_proxy_has(JSContext *ctx,JSValue obj,JSAtom atom)

{
  JSObject *p;
  int iVar1;
  JSProxyData *pJVar2;
  JSValue JVar3;
  JSValue JVar4;
  JSValue method;
  JSPropertyDescriptor desc;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValue local_48;
  
  pJVar2 = get_proxy_method(ctx,&method,obj,99);
  if (pJVar2 == (JSProxyData *)0x0) {
    return -1;
  }
  if ((int)method.tag != 3) {
    JVar3 = JS_AtomToValue(ctx,atom);
    if ((int)JVar3.tag == 6) {
      JVar3.tag = method.tag;
      JVar3.u.float64 = method.u.float64;
      JS_FreeValue(ctx,JVar3);
    }
    else {
      local_58.ptr = *(void **)&(pJVar2->target).u;
      iStack_50 = (pJVar2->target).tag;
      JVar4.tag = method.tag;
      JVar4.u.float64 = method.u.float64;
      local_48 = JVar3;
      JVar4 = JS_CallFree(ctx,JVar4,pJVar2->handler,2,(JSValue *)&local_58);
      JS_FreeValue(ctx,JVar3);
      if ((int)JVar4.tag != 6) {
        iVar1 = JS_ToBoolFree(ctx,JVar4);
        if (iVar1 != 0) {
          return iVar1;
        }
        p = (JSObject *)(pJVar2->target).u.ptr;
        iVar1 = JS_GetOwnPropertyInternal(ctx,&desc,p,atom);
        if (-1 < iVar1) {
          if ((iVar1 == 0) ||
             ((js_free_desc(ctx,&desc), ((byte)desc.flags & 1) != 0 &&
              (((p->field_0).header.dummy1 & 1) != 0)))) {
            return 0;
          }
          JS_ThrowTypeError(ctx,"proxy: inconsistent has");
        }
      }
    }
    return -1;
  }
  iVar1 = JS_HasProperty(ctx,pJVar2->target,atom);
  return iVar1;
}

Assistant:

static int js_proxy_has(JSContext *ctx, JSValueConst obj, JSAtom atom)
{
    JSProxyData *s;
    JSValue method, ret1, atom_val;
    int ret, res;
    JSObject *p;
    JSValueConst args[2];
    BOOL res2;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_has);
    if (!s)
        return -1;
    if (JS_IsUndefined(method))
        return JS_HasProperty(ctx, s->target, atom);
    atom_val = JS_AtomToValue(ctx, atom);
    if (JS_IsException(atom_val)) {
        JS_FreeValue(ctx, method);
        return -1;
    }
    args[0] = s->target;
    args[1] = atom_val;
    ret1 = JS_CallFree(ctx, method, s->handler, 2, args);
    JS_FreeValue(ctx, atom_val);
    if (JS_IsException(ret1))
        return -1;
    ret = JS_ToBoolFree(ctx, ret1);
    if (!ret) {
        JSPropertyDescriptor desc;
        p = JS_VALUE_GET_OBJ(s->target);
        res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
        if (res < 0)
            return -1;
        if (res) {
            res2 = !(desc.flags & JS_PROP_CONFIGURABLE);
            js_free_desc(ctx, &desc);
            if (res2 || !p->extensible) {
                JS_ThrowTypeError(ctx, "proxy: inconsistent has");
                return -1;
            }
        }
    }
    return ret;
}